

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

void __thiscall state_t::state_t(state_t *this,size_t width,size_t height,tiles_t *tiles)

{
  tiles_t *this_00;
  bool bVar1;
  reference __x;
  value_type *t;
  const_iterator __end1;
  const_iterator __begin1;
  tiles_t *__range1;
  allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_> local_41;
  vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  local_40;
  tiles_t *local_28;
  tiles_t *tiles_local;
  size_t height_local;
  size_t width_local;
  state_t *this_local;
  
  local_28 = tiles;
  tiles_local = (tiles_t *)height;
  height_local = width;
  width_local = (size_t)this;
  std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>::allocator(&local_41);
  std::
  vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  ::vector(&local_40,width,&local_41);
  std::
  allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>
  ::allocator((allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>
               *)((long)&__range1 + 3));
  std::
  vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ::vector(&this->image,height,&local_40,
           (allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>
            *)((long)&__range1 + 3));
  std::
  allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>
  ::~allocator((allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>
                *)((long)&__range1 + 3));
  std::
  vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>
  ::~vector(&local_40);
  std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>::~allocator(&local_41)
  ;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->available);
  this_00 = local_28;
  this->row = 0;
  this->col = 0;
  this->w = height_local;
  this->h = (size_t)tiles_local;
  __end1 = std::
           unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
           ::begin(local_28);
  t = (value_type *)
      std::
      unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator==
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_false>
                         *)&t);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __x = std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_false,_false>
          ::operator*(&__end1);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              (&this->available,&__x->first);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_false,_false>::
    operator++(&__end1);
  }
  return;
}

Assistant:

state_t(size_t width, size_t height, const tiles_t& tiles)
      : w{width}, h{height}, image(height, image_t::value_type(width))
  {
    for (const auto& t : tiles) {
      available.insert(t.first);
    }
  }